

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall MinVR::VRDatumFloat::~VRDatumFloat(VRDatumFloat *this)

{
  void *in_RDI;
  
  ~VRDatumFloat((VRDatumFloat *)0x164c08);
  operator_delete(in_RDI,0x68);
  return;
}

Assistant:

VRDatumFloat(const VRFloat inVal) :
    VRDatumSpecialized<VRFloat, VRCORETYPE_FLOAT>(inVal) {}